

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5TokenizerModule * fts5LocateTokenizer(Fts5Global *pGlobal,char *zName)

{
  int iVar1;
  Fts5TokenizerModule *local_20;
  Fts5TokenizerModule *pMod;
  char *zName_local;
  Fts5Global *pGlobal_local;
  
  if (zName == (char *)0x0) {
    local_20 = pGlobal->pDfltTok;
  }
  else {
    local_20 = pGlobal->pTok;
    while ((local_20 != (Fts5TokenizerModule *)0x0 &&
           (iVar1 = sqlite3_stricmp(zName,local_20->zName), iVar1 != 0))) {
      local_20 = local_20->pNext;
    }
  }
  return local_20;
}

Assistant:

static Fts5TokenizerModule *fts5LocateTokenizer(
  Fts5Global *pGlobal, 
  const char *zName
){
  Fts5TokenizerModule *pMod = 0;

  if( zName==0 ){
    pMod = pGlobal->pDfltTok;
  }else{
    for(pMod=pGlobal->pTok; pMod; pMod=pMod->pNext){
      if( sqlite3_stricmp(zName, pMod->zName)==0 ) break;
    }
  }

  return pMod;
}